

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstDumper.cc
# Opt level: O0

int __thiscall mcc::AstDumper::Visit(AstDumper *this,Index *index)

{
  int iVar1;
  ostream *poVar2;
  element_type *peVar3;
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  Index *local_18;
  Index *index_local;
  AstDumper *this_local;
  
  this->spaces_ = this->spaces_ + 2;
  poVar2 = this->out_;
  iVar1 = this->spaces_;
  local_18 = index;
  index_local = (Index *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,(long)iVar1,' ',&local_39);
  poVar2 = std::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2,"<index>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  poVar2 = this->out_;
  iVar1 = this->spaces_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,(long)(iVar1 + 2),' ',&local_71);
  poVar2 = std::operator<<(poVar2,local_70);
  std::operator<<(poVar2,"<name>\n");
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  peVar3 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_18->name_);
  (*peVar3->_vptr_Expr[1])(peVar3,this);
  poVar2 = this->out_;
  iVar1 = this->spaces_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,(long)(iVar1 + 2),' ',&local_99);
  poVar2 = std::operator<<(poVar2,local_98);
  std::operator<<(poVar2,"</name>\n");
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  poVar2 = this->out_;
  iVar1 = this->spaces_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,(long)(iVar1 + 2),' ',&local_c1);
  poVar2 = std::operator<<(poVar2,local_c0);
  std::operator<<(poVar2,"<index-expr>\n");
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  this->spaces_ = this->spaces_ + 2;
  peVar3 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_18->index_);
  (*peVar3->_vptr_Expr[1])(peVar3,this);
  this->spaces_ = this->spaces_ + -2;
  poVar2 = this->out_;
  iVar1 = this->spaces_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,(long)(iVar1 + 2),' ',&local_e9);
  poVar2 = std::operator<<(poVar2,local_e8);
  std::operator<<(poVar2,"</index-expr>\n");
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  poVar2 = this->out_;
  iVar1 = this->spaces_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,(long)iVar1,' ',&local_111);
  poVar2 = std::operator<<(poVar2,local_110);
  poVar2 = std::operator<<(poVar2,"</index>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  this->spaces_ = this->spaces_ + -2;
  return 0;
}

Assistant:

int AstDumper::Visit(Index& index) {
  spaces_ += TAB_SIZE;
  out_ << std::string(spaces_, ' ') << "<index>" << std::endl;
  out_ << std::string(spaces_ + 2, ' ') << "<name>\n";
  index.name_->Accept(*this);
  out_ << std::string(spaces_ + 2, ' ') << "</name>\n";

  out_ << std::string(spaces_ + 2, ' ') << "<index-expr>\n";
  spaces_ += TAB_SIZE;
  index.index_->Accept(*this);
  spaces_ -= TAB_SIZE;
  out_ << std::string(spaces_ + 2, ' ') << "</index-expr>\n";

  out_ << std::string(spaces_, ' ') << "</index>" << std::endl;
  spaces_ -= TAB_SIZE;
  return 0;
}